

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O0

void draw_line(float *line_dir,float radius,float *dot_dir,float *c)

{
  float fVar1;
  double dVar2;
  float local_30;
  float dp;
  vec2 line_perp;
  float *c_local;
  float *dot_dir_local;
  float radius_local;
  float *line_dir_local;
  
  local_30 = line_dir[1] * -1.0;
  dp = *line_dir;
  line_perp = (vec2)c;
  fVar1 = vec2_mul_inner(dot_dir,&local_30);
  if (0.0 <= fVar1) {
    dVar2 = std::floor((double)(ulong)(uint)(radius / ((1.0 - *(float *)line_perp) * 3.0 * 100.0)));
    dVar2 = std::fmod((double)(ulong)(uint)fVar1,dVar2);
    if (SUB84(dVar2,0) < 0.1) {
      vec3_scale((float *)line_perp,(float *)line_perp,0.0);
      return;
    }
  }
  if (fVar1 < 0.0) {
    dVar2 = std::floor((double)(ulong)(uint)(radius / ((1.0 - *(float *)line_perp) * 3.0 * 100.0)));
    dVar2 = std::fmod((double)(ulong)(uint)fVar1,dVar2);
    if (-0.1 < SUB84(dVar2,0)) {
      vec3_scale((float *)line_perp,(float *)line_perp,0.0);
      return;
    }
  }
  *(undefined4 *)line_perp = 0x3f800000;
  *(undefined4 *)((long)line_perp + 4) = 0x3f800000;
  *(undefined4 *)((long)line_perp + 8) = 0x3f800000;
  return;
}

Assistant:

void draw_line(const vec2 line_dir, const float radius, const vec2 dot_dir, vec3 c){
    vec2 line_perp = {-1*line_dir[1], line_dir[0]};
    float dp = vec2_mul_inner(dot_dir, line_perp);
    if(dp >= 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) < 0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else if(dp < 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) > -0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else {
        c[0] = 1.0f;
        c[1] = 1.0f;
        c[2] = 1.0f;
    }
}